

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O3

void start_output_bmp(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  bmp_dest_ptr dest;
  int map_colors;
  bool bVar7;
  undefined4 uStack_3a;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined2 uStack_32;
  byte bStack_30;
  undefined1 uStack_2f;
  undefined2 uStack_2e;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined4 uStack_28;
  undefined1 uStack_24;
  undefined1 uStack_23;
  undefined2 uStack_22;
  
  if (*(int *)&dinfo[1].output_file != 0) {
    return;
  }
  if (*(int *)&dinfo[1].start_output == 0) {
    write_bmp_header(cinfo,(bmp_dest_ptr)dinfo);
    return;
  }
  JVar1 = cinfo->out_color_space;
  bVar4 = false;
  if (JVar1 == JCS_RGB || JVar1 - JCS_EXT_RGB < 10) {
    bVar7 = cinfo->quantize_colors == 0;
    bVar4 = !bVar7;
    bStack_30 = bVar7 << 4 | 8;
    map_colors = (uint)bVar4 << 8;
  }
  else {
    bStack_30 = 0x18;
    if (JVar1 == JCS_CMYK) {
      map_colors = 0;
    }
    else {
      map_colors = 0;
      if (JVar1 != JCS_RGB565) {
        map_colors = 0x100;
        bVar4 = true;
        bStack_30 = 8;
      }
    }
  }
  uVar2 = cinfo->output_height;
  lVar5 = (ulong)*(uint *)((long)&dinfo[1].finish_output + 4) * (ulong)uVar2 +
          (ulong)(uint)(map_colors * 3) + 0x1a;
  uStack_28 = 0;
  uStack_2e = 0x4d42;
  uStack_2c = (undefined1)lVar5;
  uStack_2b = (undefined1)((ulong)lVar5 >> 8);
  uStack_2a = (undefined1)((ulong)lVar5 >> 0x10);
  uStack_29 = (undefined1)((ulong)lVar5 >> 0x18);
  uStack_24 = 0x1a;
  uStack_23 = (undefined1)((uint)(map_colors * 3) >> 8);
  uStack_22 = 0;
  uStack_3a = 0xc;
  uStack_36 = (undefined1)cinfo->output_width;
  uStack_35 = (undefined1)(cinfo->output_width >> 8);
  uStack_34 = (undefined1)uVar2;
  uStack_33 = (undefined1)(uVar2 >> 8);
  uStack_32 = 1;
  uStack_2f = 0;
  sVar6 = fwrite(&uStack_2e,1,0xe,(FILE *)dinfo->output_file);
  if (sVar6 != 0xe) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  sVar6 = fwrite(&uStack_3a,1,0xc,(FILE *)dinfo->output_file);
  if (sVar6 != 0xc) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x25;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (bVar4) {
    write_colormap(cinfo,(bmp_dest_ptr)dinfo->output_file,map_colors,3);
    return;
  }
  return;
}

Assistant:

METHODDEF(void)
start_output_bmp(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;

  if (!dest->use_inversion_array) {
    /* Write the header and colormap */
    if (dest->is_os2)
      write_os2_header(cinfo, dest);
    else
      write_bmp_header(cinfo, dest);
  }
}